

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crl.cc
# Opt level: O2

CRLRevocationStatus
bssl::CheckCRL(string_view raw_crl,ParsedCertificateList *valid_chain,size_t target_cert_index,
              ParsedDistributionPoint *cert_dp,int64_t verify_time_epoch_seconds,
              optional<long> max_age_seconds)

{
  size_t *psVar1;
  Input *pIVar2;
  pointer psVar3;
  ParsedCertificate *this;
  _Head_base<0UL,_bssl::GeneralNames_*,_false> _Var4;
  ParsedCertificate *this_00;
  Input rhs;
  Input rhs_00;
  Input signed_data;
  Input lhs;
  Input lhs_00;
  Input algorithm_identifier;
  Input algorithm_identifier_00;
  Input input;
  size_t sVar5;
  bool bVar6;
  CRLRevocationStatus CVar7;
  optional<bssl::SignatureAlgorithm> oVar8;
  ParsedBasicConstraints *pPVar9;
  _Rb_tree_node_base *p_Var10;
  BitString *this_01;
  ParsedCrlTbsCertList *out;
  ulong uVar11;
  CRLRevocationStatus CVar12;
  GeneralizedTime *this_update;
  _Storage<long,_true> extension;
  optional<bssl::der::Input> *revoked_certificates_tlv;
  int64_t iVar13;
  ulong uVar14;
  long lVar15;
  Input crl_tlv;
  Input tbs_tlv;
  Input name_rdn_sequence;
  Input oid;
  Input extension_value;
  Input cert_serial;
  optional<long> max_age_seconds_00;
  unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> distribution_point_names;
  ContainedCertsType only_contains_cert_type;
  _Storage<bssl::SignatureAlgorithm,_true> local_1b0;
  Input tbs_cert_list_tlv;
  Input name_rdn;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_180;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_168;
  uchar *local_150;
  Parser parser;
  string normalized_crl_issuer;
  ParsedExtension idp_extension;
  Input signature_algorithm_tlv;
  ParsedCrlTbsCertList tbs_cert_list;
  BitString signature_value;
  
  psVar3 = (valid_chain->
           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(valid_chain->
                    super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <=
      target_cert_index) {
    abort();
  }
  if ((cert_dp->reasons).super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::der::Input>._M_engaged != false) {
    return MAX_VALUE;
  }
  if ((cert_dp->crl_issuer).super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::der::Input>._M_engaged != false) {
    return MAX_VALUE;
  }
  this = psVar3[target_cert_index].
         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  tbs_cert_list_tlv.data_.data_ = (uchar *)0x0;
  tbs_cert_list_tlv.data_.size_ = 0;
  out = (ParsedCrlTbsCertList *)&signature_algorithm_tlv;
  signature_algorithm_tlv.data_.data_ = (uchar *)0x0;
  signature_algorithm_tlv.data_.size_ = 0;
  signature_value.bytes_.data_.data_ = (uchar *)0x0;
  signature_value.bytes_.data_.size_ = 0;
  signature_value.unused_bits_ = '\0';
  crl_tlv.data_.size_ = (size_t)&tbs_cert_list_tlv;
  crl_tlv.data_.data_ = (uchar *)raw_crl._M_len;
  iVar13 = verify_time_epoch_seconds;
  bVar6 = ParseCrlCertificateList
                    ((bssl *)raw_crl._M_str,crl_tlv,(Input *)out,&signature_value.bytes_,
                     (BitString *)verify_time_epoch_seconds);
  if (!bVar6) {
    return MAX_VALUE;
  }
  tbs_cert_list.version = V1;
  tbs_cert_list.next_update.super__Optional_base<bssl::der::GeneralizedTime,_true,_true>._M_payload.
  super__Optional_payload_base<bssl::der::GeneralizedTime>._M_engaged = false;
  tbs_cert_list.revoked_certificates_tlv.super__Optional_base<bssl::der::Input,_true,_true>.
  _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
  tbs_cert_list.crl_extensions_tlv.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
  super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
  tbs_cert_list.signature_algorithm_tlv.data_.data_ = (uchar *)0x0;
  tbs_cert_list.signature_algorithm_tlv.data_.size_ = 0;
  tbs_cert_list.issuer_tlv.data_.data_ = (uchar *)0x0;
  tbs_cert_list.issuer_tlv.data_.size_ = 0;
  tbs_tlv.data_.size_ = (size_t)&tbs_cert_list;
  tbs_tlv.data_.data_ = (uchar *)tbs_cert_list_tlv.data_.size_;
  bVar6 = ParseCrlTbsCertList((bssl *)tbs_cert_list_tlv.data_.data_,tbs_tlv,out);
  if (!bVar6) {
    return MAX_VALUE;
  }
  algorithm_identifier.data_.size_ = signature_algorithm_tlv.data_.size_;
  algorithm_identifier.data_.data_ = signature_algorithm_tlv.data_.data_;
  _local_1b0 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
               ParseSignatureAlgorithm(algorithm_identifier);
  if (((ulong)_local_1b0 >> 0x20 & 1) == 0) {
    return MAX_VALUE;
  }
  algorithm_identifier_00.data_.size_ = tbs_cert_list.signature_algorithm_tlv.data_.size_;
  algorithm_identifier_00.data_.data_ = tbs_cert_list.signature_algorithm_tlv.data_.data_;
  oVar8 = ParseSignatureAlgorithm(algorithm_identifier_00);
  if (local_1b0._M_value !=
      oVar8.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::SignatureAlgorithm>._M_payload ||
      ((ulong)oVar8.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
              super__Optional_payload_base<bssl::SignatureAlgorithm> & 0x100000000) == 0) {
    return MAX_VALUE;
  }
  this_update = (GeneralizedTime *)0x0;
  if (tbs_cert_list.next_update.super__Optional_base<bssl::der::GeneralizedTime,_true,_true>.
      _M_payload.super__Optional_payload_base<bssl::der::GeneralizedTime>._M_engaged != false) {
    this_update = (GeneralizedTime *)&tbs_cert_list.next_update;
  }
  extension._M_value._4_4_ = 0;
  extension._M_value._0_4_ =
       max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._8_4_;
  max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._8_8_ = iVar13;
  max_age_seconds_00.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = extension._M_value;
  bVar6 = CheckRevocationDateValid
                    ((bssl *)&tbs_cert_list.this_update,this_update,
                     (GeneralizedTime *)verify_time_epoch_seconds,
                     max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload._M_value,max_age_seconds_00);
  if (!bVar6) {
    return MAX_VALUE;
  }
  normalized_crl_issuer._M_dataplus._M_p = (pointer)&normalized_crl_issuer.field_2;
  normalized_crl_issuer._M_string_length = 0;
  normalized_crl_issuer.field_2._M_local_buf[0] = '\0';
  input.data_.size_ = tbs_cert_list.issuer_tlv.data_.size_;
  input.data_.data_ = tbs_cert_list.issuer_tlv.data_.data_;
  der::Parser::Parser(&parser,input);
  name_rdn.data_.data_ = (uchar *)0x0;
  name_rdn.data_.size_ = 0;
  CertErrors::CertErrors((CertErrors *)&idp_extension);
  bVar6 = der::Parser::ReadTag(&parser,0x20000010,&name_rdn);
  if ((!bVar6) ||
     (name_rdn_sequence.data_.size_ = (size_t)&normalized_crl_issuer,
     name_rdn_sequence.data_.data_ = (uchar *)name_rdn.data_.size_,
     bVar6 = NormalizeName((bssl *)name_rdn.data_.data_,name_rdn_sequence,(string *)&idp_extension,
                           (CertErrors *)extension), !bVar6)) {
    CertErrors::~CertErrors((CertErrors *)&idp_extension);
    CVar12 = MAX_VALUE;
    goto LAB_003786c3;
  }
  bVar6 = der::Parser::HasMore(&parser);
  CertErrors::~CertErrors((CertErrors *)&idp_extension);
  CVar12 = MAX_VALUE;
  if ((bVar6) ||
     (lhs.data_.size_ = normalized_crl_issuer._M_string_length,
     lhs.data_.data_ = (uchar *)normalized_crl_issuer._M_dataplus._M_p,
     rhs.data_.data_ = *(uchar **)&(this->normalized_issuer_)._M_dataplus,
     rhs.data_.size_ = (this->normalized_issuer_)._M_string_length, bVar6 = der::operator!=(lhs,rhs)
     , bVar6)) goto LAB_003786c3;
  if (tbs_cert_list.crl_extensions_tlv.super__Optional_base<bssl::der::Input,_true,_true>._M_payload
      .super__Optional_payload_base<bssl::der::Input>._M_engaged == true) {
    psVar1 = &parser.cbs_.len;
    parser.cbs_.len._0_4_ = 0;
    parser.advance_len_ = 0;
    bVar6 = ParseExtensions(tbs_cert_list.crl_extensions_tlv.
                            super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                            super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_
                            ,(map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                              *)&parser);
    if (bVar6) {
      idp_extension.value.data_.data_ = (uchar *)0x0;
      idp_extension.value.data_.size_ = 0;
      idp_extension.oid.data_.data_ = (uchar *)0x0;
      idp_extension.oid.data_.size_ = 0;
      idp_extension.critical = false;
      oid.data_.size_ = (size_t)&parser;
      oid.data_.data_ = (uchar *)0x3;
      bVar6 = ConsumeExtension((bssl *)&(anonymous_namespace)::kIssuingDistributionPointOid,oid,
                               (map<bssl::der::Input,_bssl::ParsedExtension,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                                *)&idp_extension,(ParsedExtension *)extension);
      p_Var10 = (_Rb_tree_node_base *)psVar1;
      if (!bVar6) {
LAB_00378701:
        for (; p_Var10 != (_Rb_tree_node_base *)psVar1;
            p_Var10 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var10)) {
          if (*(char *)&p_Var10[2]._M_left != '\0') goto LAB_00378720;
        }
        ::std::
        _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
        ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                     *)&parser);
        goto LAB_0037873c;
      }
      distribution_point_names._M_t.
      super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>._M_t.
      super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>.
      super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl =
           (__uniq_ptr_data<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>,_true,_true>
           )(__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>)0x0;
      extension_value.data_.size_ = (size_t)&distribution_point_names;
      extension_value.data_.data_ = (uchar *)idp_extension.value.data_.size_;
      bVar6 = ParseIssuingDistributionPoint
                        ((bssl *)idp_extension.value.data_.data_,extension_value,
                         (unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> *
                         )&only_contains_cert_type,(ContainedCertsType *)extension);
      if (bVar6) {
        if ((__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>)
            distribution_point_names._M_t.
            super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>._M_t
            .super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>.
            super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>)0x0) {
LAB_0037865c:
          if (only_contains_cert_type == CA_CERTS) {
            if ((this->has_basic_constraints_ == true) &&
               (pPVar9 = ParsedCertificate::basic_constraints(this), pPVar9->is_ca == true)) {
LAB_003786ef:
              ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::
              ~unique_ptr(&distribution_point_names);
              goto LAB_00378701;
            }
          }
          else if ((only_contains_cert_type != USER_CERTS) ||
                  (((this->has_basic_constraints_ != true ||
                    (pPVar9 = ParsedCertificate::basic_constraints(this), pPVar9->is_ca == false))
                   && (V2 < (this->tbs_).version)))) goto LAB_003786ef;
        }
        else {
          _Var4._M_head_impl =
               (cert_dp->distribution_point_fullname)._M_t.
               super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>.
               _M_t.
               super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
               .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl;
          if (_Var4._M_head_impl != (GeneralNames *)0x0) {
            ::std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&local_168,&(_Var4._M_head_impl)->uniform_resource_identifiers);
            ::std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&local_180,
                     (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)((long)distribution_point_names._M_t.
                               super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                               .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl +
                        0x90));
            ::std::
            __sort<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_168._M_impl.super__Vector_impl_data._M_start,
                       local_168._M_impl.super__Vector_impl_data._M_finish);
            ::std::
            __sort<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_180._M_impl.super__Vector_impl_data._M_start,
                       local_180._M_impl.super__Vector_impl_data._M_finish);
            name_rdn.data_.data_ = (uchar *)0x0;
            name_rdn.data_.size_ = 0;
            ::std::
            __set_intersection<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,std::back_insert_iterator<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_168._M_impl.super__Vector_impl_data._M_start,
                       local_168._M_impl.super__Vector_impl_data._M_finish,
                       local_180._M_impl.super__Vector_impl_data._M_start,
                       local_180._M_impl.super__Vector_impl_data._M_finish);
            sVar5 = name_rdn.data_.size_;
            local_150 = name_rdn.data_.data_;
            ::std::
            _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::~_Vector_base((_Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)&name_rdn);
            ::std::
            _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::~_Vector_base(&local_180);
            ::std::
            _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::~_Vector_base(&local_168);
            if (local_150 != (uchar *)sVar5) goto LAB_0037865c;
          }
        }
      }
      ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::~unique_ptr
                (&distribution_point_names);
    }
LAB_00378720:
    ::std::
    _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
    ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::ParsedExtension>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::ParsedExtension>_>_>
                 *)&parser);
  }
  else {
LAB_0037873c:
    uVar11 = target_cert_index + 1;
    lVar15 = target_cert_index * 0x10;
    while( true ) {
      psVar3 = (valid_chain->
               super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (long)(valid_chain->
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4;
      CVar7 = MAX_VALUE;
      if (uVar14 <= uVar11) break;
      this_00 = *(ParsedCertificate **)
                 ((long)&psVar3[1].
                         super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar15);
      lhs_00.data_.size_ = normalized_crl_issuer._M_string_length;
      lhs_00.data_.data_ = (uchar *)normalized_crl_issuer._M_dataplus._M_p;
      rhs_00.data_.data_ = *(uchar **)&(this_00->normalized_subject_)._M_dataplus;
      rhs_00.data_.size_ = (this_00->normalized_subject_)._M_string_length;
      bVar6 = der::operator!=(lhs_00,rhs_00);
      if (!bVar6) {
        if (this_00->has_key_usage_ == true) {
          this_01 = ParsedCertificate::key_usage(this_00);
          bVar6 = der::BitString::AssertsBit(this_01,6);
          if (!bVar6) goto LAB_003787e1;
        }
        signed_data.data_.size_ = tbs_cert_list_tlv.data_.size_;
        signed_data.data_.data_ = tbs_cert_list_tlv.data_.data_;
        pIVar2 = &(this_00->tbs_).spki_tlv;
        revoked_certificates_tlv = (optional<bssl::der::Input> *)(pIVar2->data_).data_;
        bVar6 = VerifySignedData(local_1b0._M_value,signed_data,&signature_value,
                                 (Input)pIVar2->data_,(SignatureVerifyCache *)0x0);
        if (bVar6) {
          cert_serial.data_.size_._0_4_ = tbs_cert_list.version;
          cert_serial.data_.data_ = (uchar *)(this->tbs_).serial_number.data_.size_;
          cert_serial.data_.size_._4_4_ = 0;
          CVar7 = GetCRLStatusForCert((bssl *)(this->tbs_).serial_number.data_.data_,cert_serial,
                                      (int)&tbs_cert_list + 0x40,revoked_certificates_tlv);
          break;
        }
      }
LAB_003787e1:
      uVar11 = uVar11 + 1;
      lVar15 = lVar15 + 0x10;
    }
    CVar12 = MAX_VALUE;
    if (uVar11 < uVar14) {
      CVar12 = CVar7;
    }
  }
LAB_003786c3:
  ::std::__cxx11::string::~string((string *)&normalized_crl_issuer);
  return CVar12;
}

Assistant:

CRLRevocationStatus CheckCRL(std::string_view raw_crl,
                             const ParsedCertificateList &valid_chain,
                             size_t target_cert_index,
                             const ParsedDistributionPoint &cert_dp,
                             int64_t verify_time_epoch_seconds,
                             std::optional<int64_t> max_age_seconds) {
  BSSL_CHECK(target_cert_index < valid_chain.size());

  if (cert_dp.reasons) {
    // Reason codes are not supported. If the distribution point contains a
    // subset of reasons then skip it. We aren't interested in subsets of CRLs
    // and the RFC states that there MUST be a CRL that covers all reasons.
    return CRLRevocationStatus::UNKNOWN;
  }
  if (cert_dp.crl_issuer) {
    // Indirect CRLs are not supported.
    return CRLRevocationStatus::UNKNOWN;
  }

  const ParsedCertificate *target_cert = valid_chain[target_cert_index].get();

  // 6.3.3 (a) Update the local CRL cache by obtaining a complete CRL, a
  //           delta CRL, or both, as required.
  //
  // This implementation only supports complete CRLs and takes the CRL as
  // input, it is up to the caller to provide an up to date CRL.

  der::Input tbs_cert_list_tlv;
  der::Input signature_algorithm_tlv;
  der::BitString signature_value;
  if (!ParseCrlCertificateList(StringAsBytes(raw_crl), &tbs_cert_list_tlv,
                               &signature_algorithm_tlv, &signature_value)) {
    return CRLRevocationStatus::UNKNOWN;
  }

  ParsedCrlTbsCertList tbs_cert_list;
  if (!ParseCrlTbsCertList(tbs_cert_list_tlv, &tbs_cert_list)) {
    return CRLRevocationStatus::UNKNOWN;
  }

  // 5.1.1.2  signatureAlgorithm
  //
  // TODO(https://crbug.com/749276): Check the signature algorithm against
  // policy.
  std::optional<SignatureAlgorithm> signature_algorithm =
      ParseSignatureAlgorithm(signature_algorithm_tlv);
  if (!signature_algorithm) {
    return CRLRevocationStatus::UNKNOWN;
  }

  //    This field MUST contain the same algorithm identifier as the
  //    signature field in the sequence tbsCertList (Section 5.1.2.2).
  std::optional<SignatureAlgorithm> tbs_alg =
      ParseSignatureAlgorithm(tbs_cert_list.signature_algorithm_tlv);
  if (!tbs_alg || *signature_algorithm != *tbs_alg) {
    return CRLRevocationStatus::UNKNOWN;
  }

  // Check CRL dates. Roughly corresponds to 6.3.3 (a) (1) but does not attempt
  // to update the CRL if it is out of date.
  if (!CheckRevocationDateValid(tbs_cert_list.this_update,
                                tbs_cert_list.next_update.has_value()
                                    ? &tbs_cert_list.next_update.value()
                                    : nullptr,
                                verify_time_epoch_seconds, max_age_seconds)) {
    return CRLRevocationStatus::UNKNOWN;
  }

  // 6.3.3 (a) (2) is skipped: This implementation does not support delta CRLs.

  // 6.3.3 (b) Verify the issuer and scope of the complete CRL as follows:
  // 6.3.3 (b) (1) If the DP includes cRLIssuer, then verify that the issuer
  //               field in the complete CRL matches cRLIssuer in the DP and
  //               that the complete CRL contains an issuing distribution
  //               point extension with the indirectCRL boolean asserted.
  //
  // Nothing is done here since distribution points with crlIssuer were skipped
  // above.

  // 6.3.3 (b) (1) Otherwise, verify that the CRL issuer matches the
  //               certificate issuer.
  //
  // Normalization for the name comparison is used although the RFC is not
  // clear on this. There are several places that explicitly are called out as
  // requiring identical encodings:
  //
  // 4.2.1.13.  CRL Distribution Points (cert extension) says the DP cRLIssuer
  //    field MUST be exactly the same as the encoding in issuer field of the
  //    CRL.
  //
  // 5.2.5.  Issuing Distribution Point (crl extension)
  //    The identical encoding MUST be used in the distributionPoint fields
  //    of the certificate and the CRL.
  //
  // 5.3.3.  Certificate Issuer (crl entry extension) also says "The encoding of
  //    the DN MUST be identical to the encoding used in the certificate"
  //
  // But 6.3.3 (b) (1) just says "matches". Also NIST PKITS includes at least
  // one test that requires normalization here.
  // TODO(https://crbug.com/749276): could do exact comparison first and only
  // fall back to normalizing if that fails.
  std::string normalized_crl_issuer;
  if (!NormalizeNameTLV(tbs_cert_list.issuer_tlv, &normalized_crl_issuer)) {
    return CRLRevocationStatus::UNKNOWN;
  }
  if (der::Input(StringAsBytes(normalized_crl_issuer)) !=
      target_cert->normalized_issuer()) {
    return CRLRevocationStatus::UNKNOWN;
  }

  if (tbs_cert_list.crl_extensions_tlv.has_value()) {
    std::map<der::Input, ParsedExtension> extensions;
    if (!ParseExtensions(*tbs_cert_list.crl_extensions_tlv, &extensions)) {
      return CRLRevocationStatus::UNKNOWN;
    }

    // 6.3.3 (b) (2) If the complete CRL includes an issuing distribution point
    //               (IDP) CRL extension, check the following:
    ParsedExtension idp_extension;
    if (ConsumeExtension(der::Input(kIssuingDistributionPointOid), &extensions,
                         &idp_extension)) {
      std::unique_ptr<GeneralNames> distribution_point_names;
      ContainedCertsType only_contains_cert_type;
      if (!ParseIssuingDistributionPoint(idp_extension.value,
                                         &distribution_point_names,
                                         &only_contains_cert_type)) {
        return CRLRevocationStatus::UNKNOWN;
      }

      if (distribution_point_names) {
        // 6.3.3. (b) (2) (i) If the distribution point name is present in the
        //                    IDP CRL extension and the distribution field is
        //                    present in the DP, then verify that one of the
        //                    names in the IDP matches one of the names in the
        //                    DP.
        // 5.2.5.  The identical encoding MUST be used in the distributionPoint
        //         fields of the certificate and the CRL.
        // TODO(https://crbug.com/749276): Check other name types?
        if (!cert_dp.distribution_point_fullname ||
            !ContainsExactMatchingName(
                cert_dp.distribution_point_fullname
                    ->uniform_resource_identifiers,
                distribution_point_names->uniform_resource_identifiers)) {
          return CRLRevocationStatus::UNKNOWN;
        }

        // 6.3.3. (b) (2) (i) If the distribution point name is present in the
        //                    IDP CRL extension and the distribution field is
        //                    omitted from the DP, then verify that one of the
        //                    names in the IDP matches one of the names in the
        //                    cRLIssuer field of the DP.
        // Indirect CRLs are not supported, if indirectCRL was specified,
        // ParseIssuingDistributionPoint would already have failed.
      }

      switch (only_contains_cert_type) {
        case ContainedCertsType::USER_CERTS:
          // 6.3.3. (b) (2) (ii)  If the onlyContainsUserCerts boolean is
          //                      asserted in the IDP CRL extension, verify
          //                      that the certificate does not include the
          //                      basic constraints extension with the cA
          //                      boolean asserted.
          // 5.2.5.  If either onlyContainsUserCerts or onlyContainsCACerts is
          //         set to TRUE, then the scope of the CRL MUST NOT include any
          //         version 1 or version 2 certificates.
          if ((target_cert->has_basic_constraints() &&
               target_cert->basic_constraints().is_ca) ||
              target_cert->tbs().version == CertificateVersion::V1 ||
              target_cert->tbs().version == CertificateVersion::V2) {
            return CRLRevocationStatus::UNKNOWN;
          }
          break;

        case ContainedCertsType::CA_CERTS:
          // 6.3.3. (b) (2) (iii) If the onlyContainsCACerts boolean is asserted
          //                      in the IDP CRL extension, verify that the
          //                      certificate includes the basic constraints
          //                      extension with the cA boolean asserted.
          // The version check is not done here, as the basicConstraints
          // extension is required, and could not be present unless it is a V3
          // certificate.
          if (!target_cert->has_basic_constraints() ||
              !target_cert->basic_constraints().is_ca) {
            return CRLRevocationStatus::UNKNOWN;
          }
          break;

        case ContainedCertsType::ANY_CERTS:
          //                (iv)  Verify that the onlyContainsAttributeCerts
          //                      boolean is not asserted.
          // If onlyContainsAttributeCerts was present,
          // ParseIssuingDistributionPoint would already have failed.
          break;
      }
    }

    for (const auto &ext : extensions) {
      // Fail if any unhandled critical CRL extensions are present.
      if (ext.second.critical) {
        return CRLRevocationStatus::UNKNOWN;
      }
    }
  }

  // 6.3.3 (c-e) skipped: delta CRLs and reason codes are not supported.

  // This implementation only supports direct CRLs where the CRL was signed by
  // one of the certs in its validated issuer chain. This allows handling some
  // cases of key rollover without requiring additional CRL issuer cert
  // discovery & path building.
  // TODO(https://crbug.com/749276): should this loop start at
  // |target_cert_index|? There doesn't seem to be anything in the specs that
  // precludes a CRL signed by a self-issued cert from covering itself. On the
  // other hand it seems like a pretty weird thing to allow and causes NIST
  // PKITS 4.5.3 to pass when it seems like it would not be intended to (since
  // issuingDistributionPoint CRL extension is not handled).
  for (size_t i = target_cert_index + 1; i < valid_chain.size(); ++i) {
    const ParsedCertificate *issuer_cert = valid_chain[i].get();

    // 6.3.3 (f) Obtain and validate the certification path for the issuer of
    //           the complete CRL.  The trust anchor for the certification
    //           path MUST be the same as the trust anchor used to validate
    //           the target certificate.
    //
    // As the |issuer_cert| is from the already validated chain, it is already
    // known to chain to the same trust anchor as the target certificate.
    if (der::Input(StringAsBytes(normalized_crl_issuer)) !=
        issuer_cert->normalized_subject()) {
      continue;
    }

    // 6.3.3 (f) If a key usage extension is present in the CRL issuer's
    //           certificate, verify that the cRLSign bit is set.
    if (issuer_cert->has_key_usage() &&
        !issuer_cert->key_usage().AssertsBit(KEY_USAGE_BIT_CRL_SIGN)) {
      continue;
    }

    // 6.3.3 (g) Validate the signature on the complete CRL using the public
    //           key validated in step (f).
    if (!VerifySignedData(*signature_algorithm, tbs_cert_list_tlv,
                          signature_value, issuer_cert->tbs().spki_tlv,
                          /*cache=*/nullptr)) {
      continue;
    }

    // 6.3.3 (h,i) skipped. This implementation does not support delta CRLs.

    // 6.3.3 (j) If (cert_status is UNREVOKED), then search for the
    //           certificate on the complete CRL.  If an entry is found that
    //           matches the certificate issuer and serial number as described
    //           in Section 5.3.3, then set the cert_status variable to the
    //           indicated reason as described in step (i).
    //
    // CRL is valid and covers |target_cert|, check if |target_cert| is present
    // in the revokedCertificates sequence.
    return GetCRLStatusForCert(target_cert->tbs().serial_number,
                               tbs_cert_list.version,
                               tbs_cert_list.revoked_certificates_tlv);

    // 6.3.3 (k,l) skipped. This implementation does not support reason codes.
  }

  // Did not find the issuer & signer of |raw_crl| in |valid_chain|.
  return CRLRevocationStatus::UNKNOWN;
}